

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O0

void __thiscall
icu_63::SpoofImpl::getNumerics
          (SpoofImpl *this,UnicodeString *input,UnicodeSet *result,UErrorCode *param_3)

{
  int8_t iVar1;
  int32_t iVar2;
  uint c;
  int iVar3;
  double dVar4;
  undefined4 local_30;
  int32_t i;
  UChar32 codePoint;
  UErrorCode *param_3_local;
  UnicodeSet *result_local;
  UnicodeString *input_local;
  SpoofImpl *this_local;
  
  UnicodeSet::clear(result);
  local_30 = 0;
  while( true ) {
    iVar2 = UnicodeString::length(input);
    if (iVar2 <= local_30) break;
    c = UnicodeString::char32At(input,local_30);
    iVar1 = u_charType_63(c);
    if (iVar1 == '\t') {
      dVar4 = u_getNumericValue_63(c);
      UnicodeSet::add(result,c - (int)dVar4);
    }
    iVar3 = 2;
    if (c < 0x10000) {
      iVar3 = 1;
    }
    local_30 = iVar3 + local_30;
  }
  return;
}

Assistant:

void SpoofImpl::getNumerics(const UnicodeString& input, UnicodeSet& result, UErrorCode& /*status*/) const {
    result.clear();

    UChar32 codePoint;
    for (int32_t i = 0; i < input.length(); i += U16_LENGTH(codePoint)) {
        codePoint = input.char32At(i);

        // Store a representative character for each kind of decimal digit
        if (u_charType(codePoint) == U_DECIMAL_DIGIT_NUMBER) {
            // Store the zero character as a representative for comparison.
            // Unicode guarantees it is codePoint - value
            result.add(codePoint - (UChar32)u_getNumericValue(codePoint));
        }
    }
}